

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

saucy_graph *
buildSim1Graph(Abc_Ntk_t *pNtk,coloring *c,Vec_Int_t *randVec,Vec_Int_t **iDep,Vec_Int_t **oDep)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  int *pModel;
  int *__ptr;
  coloring *pcVar5;
  saucy_graph *psVar6;
  int *piVar7;
  int *piVar8;
  Abc_Ntk_t *pAVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  coloring *c_00;
  
  uVar1 = pNtk->vPos->nSize;
  c_00 = (coloring *)(ulong)uVar1;
  uVar2 = pNtk->vPis->nSize;
  pModel = generateProperInputVector((Abc_Ntk_t *)(ulong)uVar2,c_00,(Vec_Int_t *)c);
  iVar10 = 0;
  if (pModel == (int *)0x0) {
    psVar6 = (saucy_graph *)0x0;
  }
  else {
    __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
    if (0 < (int)uVar1) {
      pcVar5 = (coloring *)0x0;
      iVar10 = 0;
      do {
        iVar10 = (iVar10 + 1) - (uint)(__ptr[(long)pcVar5] == 0);
        pcVar5 = (coloring *)((long)&pcVar5->lab + 1);
      } while (c_00 != pcVar5);
    }
    psVar6 = (saucy_graph *)malloc(0x18);
    piVar7 = (int *)malloc((long)(int)(uVar1 + uVar2) * 4 + 4);
    piVar8 = (int *)malloc((long)(int)(iVar10 * uVar2 * 2) << 2);
    psVar6->n = uVar1 + uVar2;
    psVar6->e = iVar10 * uVar2;
    psVar6->adj = piVar7;
    psVar6->edg = piVar8;
    *piVar7 = 0;
    if (0 < (int)uVar1) {
      pcVar5 = (coloring *)0x0;
      do {
        iVar10 = piVar7[(long)pcVar5];
        if (__ptr[(long)pcVar5] == 0) {
          piVar7[(long)((long)&pcVar5->lab + 1)] = iVar10;
        }
        else {
          pVVar3 = oDep[(long)pcVar5];
          iVar14 = pVVar3->nSize;
          iVar12 = iVar14 + iVar10;
          piVar7[(long)((long)&pcVar5->lab + 1)] = iVar12;
          if (0 < iVar14) {
            lVar11 = 0;
            do {
              if (pVVar3->nSize <= lVar11) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              piVar8[iVar10 + lVar11] = pVVar3->pArray[lVar11] + uVar1;
              lVar13 = iVar10 + lVar11;
              lVar11 = lVar11 + 1;
            } while (lVar13 + 1 < (long)iVar12);
          }
        }
        pcVar5 = (coloring *)((long)&pcVar5->lab + 1);
      } while (pcVar5 != c_00);
    }
    if (0 < (int)uVar2) {
      pAVar9 = (Abc_Ntk_t *)0x0;
      do {
        iVar10 = piVar7[(long)pAVar9->nObjCounts + (long)(int)uVar1 + -0x60];
        piVar7[(long)pAVar9->nObjCounts + (long)(int)uVar1 + -0x5f] = iVar10;
        pVVar3 = iDep[(long)pAVar9];
        iVar12 = pVVar3->nSize;
        if (0 < iVar12) {
          piVar4 = pVVar3->pArray;
          lVar11 = 0;
          iVar14 = iVar10;
          do {
            if (__ptr[piVar4[lVar11]] != 0) {
              lVar13 = (long)iVar14;
              iVar14 = iVar14 + 1;
              piVar8[lVar13] = piVar4[lVar11];
              iVar10 = iVar10 + 1;
              piVar7[(long)pAVar9->nObjCounts + (long)(int)uVar1 + -0x5f] = iVar10;
              iVar12 = pVVar3->nSize;
            }
            lVar11 = lVar11 + 1;
          } while (lVar11 < iVar12);
        }
        pAVar9 = (Abc_Ntk_t *)((long)&pAVar9->ntkType + 1);
      } while (pAVar9 != (Abc_Ntk_t *)(ulong)uVar2);
    }
    free(pModel);
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  return psVar6;
}

Assistant:

static struct saucy_graph *
buildSim1Graph( Abc_Ntk_t * pNtk, struct coloring *c, Vec_Int_t * randVec, Vec_Int_t ** iDep, Vec_Int_t ** oDep )
{
    int i, j, k;
    struct saucy_graph *g;
    int n, e, *adj, *edg;
    int * vPiValues, * output;
    int numOneOutputs = 0;
    int numouts =  Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);

    vPiValues = generateProperInputVector(pNtk, c, randVec);
    if (vPiValues == NULL) 
        return NULL;

    output = Abc_NtkVerifySimulatePattern(pNtk, vPiValues);

    for (i = 0; i < numouts; i++) {
        if (output[i])
            numOneOutputs++;
    }

    g = ABC_ALLOC(struct saucy_graph, 1);
    n = numouts + numins;
    e = numins * numOneOutputs;
    adj = ints(n+1);
    edg = ints(2*e);        
    g->n = n;
    g->e = e;
    g->adj = adj;
    g->edg = edg;   

    adj[0] = 0;
    for (i = 0; i < numouts; i++) {
        if (output[i]) {
            adj[i+1] = adj[i] + Vec_IntSize(oDep[i]);
            for (j = adj[i], k = 0; j < adj[i+1]; j++, k++)
                edg[j] = Vec_IntEntry(oDep[i], k) + numouts;
        } else {
            adj[i+1] = adj[i];
        }
    }

    for (i = 0; i < numins; i++) {
        adj[i+numouts+1] = adj[i+numouts];
        for (k = 0, j = adj[i+numouts]; k < Vec_IntSize(iDep[i]); k++) {
            if (output[Vec_IntEntry(iDep[i], k)]) {
                edg[j++] = Vec_IntEntry(iDep[i], k);
                adj[i+numouts+1]++;
            }
        }
    }

    /* print graph */
    /*for (i = 0; i < n; i++) {
        printf("%d: ", i);
        for (j = adj[i]; j < adj[i+1]; j++)
            printf("%d ", edg[j]);
        printf("\n");
    }*/

    ABC_FREE( vPiValues );  
    ABC_FREE( output );
    
    return g;   
}